

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCxxModuleBmiGenerator.cxx
# Opt level: O2

void __thiscall
cmInstallCxxModuleBmiGenerator::GenerateScriptForConfig
          (cmInstallCxxModuleBmiGenerator *this,ostream *os,string *config,Indent indent)

{
  ostream *poVar1;
  WrapQuotes in_R8D;
  string_view str;
  string local_58;
  string local_38;
  
  GetScriptLocation(&local_58,this,config);
  if ((cmOutputConverter *)local_58._M_string_length != (cmOutputConverter *)0x0) {
    poVar1 = operator<<(os,(cmScriptGeneratorIndent)indent.Level);
    poVar1 = std::operator<<(poVar1,"include(\"");
    str._M_str = (char *)0x1;
    str._M_len = (size_t)local_58._M_dataplus._M_p;
    cmOutputConverter::EscapeForCMake_abi_cxx11_
              (&local_38,(cmOutputConverter *)local_58._M_string_length,str,in_R8D);
    poVar1 = std::operator<<(poVar1,(string *)&local_38);
    std::operator<<(poVar1,"\" OPTIONAL)\n");
    std::__cxx11::string::~string((string *)&local_38);
  }
  std::__cxx11::string::~string((string *)&local_58);
  return;
}

Assistant:

void cmInstallCxxModuleBmiGenerator::GenerateScriptForConfig(
  std::ostream& os, const std::string& config, Indent indent)
{
  auto const& loc = this->GetScriptLocation(config);
  if (loc.empty()) {
    return;
  }
  os << indent << "include(\""
     << cmOutputConverter::EscapeForCMake(
          loc, cmOutputConverter::WrapQuotes::NoWrap)
     << "\" OPTIONAL)\n";
}